

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# local_file_system.cpp
# Opt level: O2

void __thiscall
duckdb::LocalFileSystem::MoveFile
          (LocalFileSystem *this,string *source,string *target,
          optional_ptr<duckdb::FileOpener,_true> opener)

{
  int iVar1;
  char *__old;
  char *__new;
  IOException *this_00;
  int *piVar2;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  allocator local_d1;
  string local_d0;
  string local_b0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  
  __old = NormalizeLocalPath(source);
  __new = NormalizeLocalPath(target);
  iVar1 = rename(__old,__new);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (IOException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_b0,"Could not rename file!",&local_d1);
  piVar2 = __errno_location();
  ::std::__cxx11::to_string(&local_d0,*piVar2);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_(&)[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_90,(char (*) [6])"errno",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0);
  ::std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,std::__cxx11::string>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_50,&local_90,&local_50,0,&local_d2,&local_d3,&local_d4);
  IOException::IOException(this_00,&local_b0,&local_50);
  __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void LocalFileSystem::MoveFile(const string &source, const string &target, optional_ptr<FileOpener> opener) {
	auto normalized_source = NormalizeLocalPath(source);
	auto normalized_target = NormalizeLocalPath(target);
	//! FIXME: rename does not guarantee atomicity or overwriting target file if it exists
	if (rename(normalized_source, normalized_target) != 0) {
		throw IOException("Could not rename file!", {{"errno", std::to_string(errno)}});
	}
}